

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O0

void update(Quadratic *idata)

{
  long in_RDI;
  double dVar1;
  vector<double,_std::allocator<double>_> *v2;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  HighsSolution *in_stack_00000010;
  HighsLp *in_stack_00000018;
  undefined1 in_stack_00000027;
  HighsSolution *in_stack_ffffffffffffffb8;
  HighsLp *in_stack_ffffffffffffffc0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  dVar1 = vectorProduct(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(double *)(in_RDI + 0x498) = dVar1;
  calculateRowValuesQuad(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  updateResidual((bool)in_stack_00000027,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_00000010,in_stack_00000008);
  v2 = (vector<double,_std::allocator<double>_> *)getNorm2(in_stack_ffffffffffffffd0);
  *(vector<double,_std::allocator<double>_> **)(in_RDI + 0x4c0) = v2;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  *(undefined8 *)(in_RDI + 0x4a0) = *(undefined8 *)(in_RDI + 0x498);
  dVar1 = vectorProduct(in_stack_ffffffffffffffd0,v2);
  *(double *)(in_RDI + 0x4a0) = dVar1 + *(double *)(in_RDI + 0x4a0);
  dVar1 = vectorProduct(in_stack_ffffffffffffffd0,v2);
  *(double *)(in_RDI + 0x4a0) =
       dVar1 / (*(double *)(in_RDI + 0x4c8) * 2.0) + *(double *)(in_RDI + 0x4a0);
  return;
}

Assistant:

void update(Quadratic& idata) {
  // lp_objective
  idata.lp_objective = vectorProduct(idata.lp.col_cost_, idata.xk.col_value);

  // residual & residual_norm_2
  calculateRowValuesQuad(idata.lp, idata.xk);
  updateResidual(idata.options.breakpoints, idata.lp, idata.xk, idata.residual);
  idata.residual_norm_2 = getNorm2(idata.residual);

  // quadratic_objective
  idata.quadratic_objective = idata.lp_objective;
  idata.quadratic_objective += vectorProduct(idata.lambda, idata.residual);
  idata.quadratic_objective +=
      vectorProduct(idata.residual, idata.residual) / (2 * idata.mu);
}